

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineArc.cpp
# Opt level: O2

void __thiscall chrono::geometry::ChLineArc::ArchiveIN(ChLineArc *this,ChArchiveIn *marchive)

{
  ChNameValue<bool> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<chrono::ChCoordsys<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChLineArc>(marchive);
  ChLine::ArchiveIN(&this->super_ChLine,marchive);
  local_30._value = &this->origin;
  local_30._name = "origin";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->radius;
  local_48._name = "radius";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->angle1;
  local_60._name = "angle1";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->angle2;
  local_78._name = "angle2";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->counterclockwise;
  local_90._name = "counterclockwise";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  return;
}

Assistant:

void ChLineArc::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLineArc>();
    // deserialize parent class
    ChLine::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(origin);
    marchive >> CHNVP(radius);
    marchive >> CHNVP(angle1);
    marchive >> CHNVP(angle2);
    marchive >> CHNVP(counterclockwise);
}